

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

int sign2(int A,int B)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (B & A) >> ((byte)tp & 0x1f);
  uVar1 = tp + tq;
  if (uVar1 != 0 && SCARRY4(tp,tq) == (int)uVar1 < 0) {
    uVar3 = 0;
    do {
      A = A >> 1;
      uVar4 = A;
      if (((uint)B >> (uVar3 & 0x1f) & 1) == 0) {
        uVar4 = 0;
      }
      uVar2 = uVar2 ^ uVar4;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  uVar2 = uVar2 - ((uVar2 >> 3 & 0x11111111) + (uVar2 >> 2 & 0x33333333) + (uVar2 >> 1 & 0x77777777)
                  );
  uVar2 = (uVar2 >> 4) + uVar2;
  return -(uVar2 - (uVar2 & 0xf0f0f0f) / 0xff & 1) | 1;
}

Assistant:

int sign2(int A,int B)
{
	int sig=1;
	int tA2=(A&B)>>tp;
	for(register int i=0;i<(tp+tq);i++)
	{
		A>>=1;
		if((B>>i)&1)
			tA2^=A;
	}
	if(bits(tA2)&1){sig=-1;}

return sig;
}